

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::
ConstructMessageRecursive<std::__cxx11::string,unsigned_long,unsigned_long,unsigned_long,unsigned_long>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
          unsigned_long params,unsigned_long params_1,unsigned_long params_2,unsigned_long params_3)

{
  string *value;
  unsigned_long in_stack_ffffffffffffff70;
  undefined1 local_88 [56];
  string local_50 [32];
  
  ::std::__cxx11::string::string((string *)local_88,(string *)values);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>
            ((ExceptionFormatValue *)(local_88 + 0x20),(ExceptionFormatValue *)local_88,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(ExceptionFormatValue *)(local_88 + 0x20));
  ::std::__cxx11::string::~string(local_50);
  ::std::__cxx11::string::~string((string *)local_88);
  ConstructMessageRecursive<unsigned_long,unsigned_long,unsigned_long,unsigned_long>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             param,params,params_1,params_2,in_stack_ffffffffffffff70);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}